

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dirtyudp.h
# Opt level: O2

void __thiscall UdpReceiver::UdpReceiver(UdpReceiver *this,int port,int bufferSize)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  
  this->port = port;
  this->bufferSize = bufferSize;
  pcVar3 = (char *)calloc((long)bufferSize,1);
  this->buffer = pcVar3;
  iVar2 = socket(2,2,0);
  this->socketFile = iVar2;
  if (iVar2 < 0) {
    error("ERROR: Could not open socket\n");
  }
  this->socketOptions = 1;
  setsockopt(iVar2,1,6,&this->socketOptions,4);
  (this->serverAddress).sin_zero[0] = '\0';
  (this->serverAddress).sin_zero[1] = '\0';
  (this->serverAddress).sin_zero[2] = '\0';
  (this->serverAddress).sin_zero[3] = '\0';
  (this->serverAddress).sin_zero[4] = '\0';
  (this->serverAddress).sin_zero[5] = '\0';
  (this->serverAddress).sin_zero[6] = '\0';
  (this->serverAddress).sin_zero[7] = '\0';
  (this->serverAddress).sin_family = 2;
  (this->serverAddress).sin_addr.s_addr = 0;
  uVar1 = (ushort)this->port;
  (this->serverAddress).sin_port = uVar1 << 8 | uVar1 >> 8;
  iVar2 = bind(this->socketFile,(sockaddr *)&this->serverAddress,0x10);
  if (-1 < iVar2) {
    this->clientLength = 0x10;
    return;
  }
  error("ERROR: There was an issue binding the socket");
}

Assistant:

UdpReceiver(int port, int bufferSize) {
      this->port = port;
      this->bufferSize = bufferSize;
      this->buffer = (char*)calloc(this->bufferSize, sizeof(char));
      // create socket
      this->socketFile = socket(AF_INET, SOCK_DGRAM, 0);
      if(this->socketFile < 0) error("ERROR: Could not open socket\n");
      // speedhax
      this->socketOptions = 1;
      setsockopt( this->socketFile,
                  SOL_SOCKET,
                  SO_BROADCAST,
                  (const void*)&this->socketOptions,
                  sizeof(int));
      // construct server address
      bzero((char*)&this->serverAddress, sizeof(this->serverAddress));
      this->serverAddress.sin_family = AF_INET;
      this->serverAddress.sin_addr.s_addr = htonl(INADDR_ANY);
      this->serverAddress.sin_port = htons((unsigned short)this->port);
      // bind socket
      if(bind(this->socketFile,
              (struct sockaddr *)&this->serverAddress,
              sizeof(this->serverAddress)) < 0)
        error("ERROR: There was an issue binding the socket");
      this->clientLength = sizeof(this->clientAddress);
    }